

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

char * __thiscall soul::RenderingVenue::Pimpl::renderActiveSessions(Pimpl *this,uint32_t numFrames)

{
  mutex *__mutex;
  pointer ppSVar1;
  rep rVar2;
  char *pcVar3;
  SessionImpl **s;
  pointer ppSVar4;
  
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->loadMeasurer).currentStart.__d.__r = rVar2;
  __mutex = &this->sessionListLock;
  std::mutex::lock(__mutex);
  if (numFrames == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pcVar3 = "Illegal frame count";
  }
  else {
    ppSVar1 = (this->activeSessions).
              super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar4 = (this->activeSessions).
                   super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar1;
        ppSVar4 = ppSVar4 + 1) {
      SessionImpl::render(*ppSVar4,numFrames);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    CPULoadMeasurer::stopMeasurement(&this->loadMeasurer);
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char* renderActiveSessions (uint32_t numFrames)
    {
        loadMeasurer.startMeasurement();

        {
            std::lock_guard<std::mutex> l (sessionListLock);

            if (numFrames == 0)
                return "Illegal frame count";

            for (auto& s : activeSessions)
                s->render (numFrames);
        }

        loadMeasurer.stopMeasurement();
        return {};
    }